

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall
wasm::(anonymous_namespace)::ModuleAnalyzer::canChangeState(wasm::Expression*,wasm::Function*)::
Walker::visitCall(wasm::Call__(void *this,Call *curr)

{
  bool bVar1;
  mapped_type *pmVar2;
  Function *local_20;
  Function *target;
  Call *curr_local;
  Walker *this_local;
  
  target = (Function *)curr;
  curr_local = (Call *)this;
  bVar1 = IString::operator==(&(curr->target).super_IString,(IString *)ASYNCIFY_START_UNWIND);
  if ((((bVar1) ||
       (bVar1 = IString::operator==((IString *)
                                    &(target->super_Importable).base.super_IString.str._M_str,
                                    (IString *)ASYNCIFY_STOP_REWIND), bVar1)) ||
      (bVar1 = IString::operator==((IString *)
                                   &(target->super_Importable).base.super_IString.str._M_str,
                                   (IString *)ASYNCIFY_GET_CALL_INDEX), bVar1)) ||
     (bVar1 = IString::operator==((IString *)
                                  &(target->super_Importable).base.super_IString.str._M_str,
                                  (IString *)ASYNCIFY_CHECK_CALL_INDEX), bVar1)) {
    *(undefined1 *)((long)this + 0xf1) = 1;
    return;
  }
  bVar1 = IString::operator==((IString *)&(target->super_Importable).base.super_IString.str._M_str,
                              (IString *)&ASYNCIFY_STOP_UNWIND);
  if ((bVar1) ||
     (bVar1 = IString::operator==((IString *)
                                  &(target->super_Importable).base.super_IString.str._M_str,
                                  (IString *)ASYNCIFY_START_REWIND), bVar1)) {
    *(undefined1 *)((long)this + 0xf2) = 1;
    return;
  }
  local_20 = Module::getFunctionOrNull
                       (*(Module **)((long)this + 0xd8),
                        (IString)*(IString *)
                                  &(target->super_Importable).base.super_IString.str._M_str);
  if (local_20 == (Function *)0x0) {
    return;
  }
  pmVar2 = std::
           map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
           ::operator[](*(map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
                          **)((long)this + 0xe8),&local_20);
  if ((pmVar2->canChangeState & 1U) == 0) {
    return;
  }
  *(undefined1 *)((long)this + 0xf1) = 1;
  return;
}

Assistant:

void visitCall(Call* curr) {
        // We only implement these at the very end, but we know that they
        // definitely change the state.
        if (curr->target == ASYNCIFY_START_UNWIND ||
            curr->target == ASYNCIFY_STOP_REWIND ||
            curr->target == ASYNCIFY_GET_CALL_INDEX ||
            curr->target == ASYNCIFY_CHECK_CALL_INDEX) {
          canChangeState = true;
          return;
        }
        if (curr->target == ASYNCIFY_STOP_UNWIND ||
            curr->target == ASYNCIFY_START_REWIND) {
          isBottomMostRuntime = true;
          return;
        }
        // The target may not exist if it is one of our temporary intrinsics.
        auto* target = module->getFunctionOrNull(curr->target);
        if (target && (*map)[target].canChangeState) {
          canChangeState = true;
        }
      }